

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O2

size_t duckdb_zstd::HUF_decompress4X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 int flags)

{
  undefined1 *puVar1;
  byte bVar2;
  HUF_DTable *pHVar3;
  HUF_DTable *pHVar4;
  int iVar5;
  BIT_DStream_status BVar6;
  BIT_DStream_status BVar7;
  BIT_DStream_status BVar8;
  BIT_DStream_status BVar9;
  size_t sVar10;
  ulong uVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  undefined1 *puVar15;
  int iVar16;
  undefined1 *puVar17;
  int iVar18;
  undefined1 *puVar19;
  undefined4 in_register_0000008c;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  void *pvVar23;
  char cVar24;
  HUF_DTable *pHVar25;
  bool bVar26;
  BIT_DStream_t BStack_118;
  BIT_DStream_t BStack_f0;
  BIT_DStream_t BStack_c8;
  BIT_DStream_t BStack_a0;
  undefined1 *puStack_78;
  HUF_DTable *pHStack_70;
  ulong uStack_68;
  undefined1 *puStack_60;
  ulong uStack_58;
  undefined1 *puStack_50;
  size_t sStack_48;
  undefined1 *puStack_40;
  undefined1 *puStack_38;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar10 = HUF_decompress4X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,flags);
    return sVar10;
  }
  if ((flags & 1U) != 0) {
    if (((flags & 0x20U) == 0) &&
       (sVar10 = HUF_decompress4X1_usingDTable_internal_fast
                           (dst,maxDstSize,cSrc,cSrcSize,DTable,
                            (HUF_DecompressFastLoopFn)CONCAT44(in_register_0000008c,flags)),
       sVar10 != 0)) {
      return sVar10;
    }
    sVar10 = HUF_decompress4X1_usingDTable_internal_bmi2(dst,maxDstSize,cSrc,cSrcSize,DTable);
    return sVar10;
  }
  if (maxDstSize < 6 || cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar22 = (ulong)*cSrc;
  uVar21 = (ulong)*(ushort *)((long)cSrc + 2);
  uVar20 = (ulong)*(ushort *)((long)cSrc + 4);
  uVar11 = uVar20 + 6 + uVar22 + uVar21;
  if (cSrcSize < uVar11) {
    return 0xffffffffffffffec;
  }
  puStack_78 = (undefined1 *)((long)dst + maxDstSize);
  uStack_68 = maxDstSize + 3 >> 2;
  puVar1 = (undefined1 *)((long)dst + uStack_68);
  puStack_50 = puVar1 + uStack_68;
  puStack_38 = puStack_50 + uStack_68;
  if (puStack_78 < puStack_38) {
    return 0xffffffffffffffec;
  }
  uStack_58 = (ulong)*(ushort *)((long)DTable + 2);
  pHStack_70 = DTable;
  sStack_48 = maxDstSize;
  sVar10 = BIT_initDStream(&BStack_a0,(void *)((long)cSrc + 6),uVar22);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  pvVar23 = (void *)((long)cSrc + uVar22 + 6);
  sVar10 = BIT_initDStream(&BStack_c8,pvVar23,uVar21);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  pvVar23 = (void *)((long)pvVar23 + uVar21);
  sVar10 = BIT_initDStream(&BStack_f0,pvVar23,uVar20);
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  sVar10 = BIT_initDStream(&BStack_118,(void *)((long)pvVar23 + uVar20),cSrcSize - uVar11);
  pHVar3 = pHStack_70;
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  puStack_40 = (undefined1 *)((long)dst + (sStack_48 - 3));
  cVar24 = (char)uStack_58;
  puVar15 = puVar1;
  puVar17 = puStack_38;
  puVar19 = puStack_50;
  if (7 < (ulong)((long)puStack_78 - (long)puStack_38)) {
    bVar12 = -cVar24 & 0x3f;
    pHStack_70 = (HUF_DTable *)(uStack_68 * 3);
    bVar26 = true;
    pHVar25 = pHStack_70;
    while ((pHVar4 = pHStack_70, bVar26 && ((undefined1 *)((long)dst + (long)pHVar25) < puStack_40))
          ) {
      uVar11 = (BStack_a0.bitContainer << ((byte)BStack_a0.bitsConsumed & 0x3f)) >> bVar12;
      bVar2 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4);
      *(undefined1 *)dst = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (BStack_c8.bitContainer << ((byte)BStack_c8.bitsConsumed & 0x3f)) >> bVar12;
      iVar5 = bVar2 + BStack_a0.bitsConsumed;
      iVar13 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + BStack_c8.bitsConsumed;
      *(undefined1 *)((long)dst + uStack_68) = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (BStack_f0.bitContainer << ((byte)BStack_f0.bitsConsumed & 0x3f)) >> bVar12;
      iVar16 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + BStack_f0.bitsConsumed;
      *(undefined1 *)((long)dst + uStack_68 * 2) = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar20 = (BStack_118.bitContainer << ((byte)BStack_118.bitsConsumed & 0x3f)) >> bVar12;
      uVar21 = (BStack_a0.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar18 = *(byte *)((long)pHVar3 + uVar20 * 2 + 4) + BStack_118.bitsConsumed;
      uVar11 = (BStack_c8.bitContainer << ((byte)iVar13 & 0x3f)) >> bVar12;
      uVar22 = (BStack_f0.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar12;
      *(undefined1 *)((long)dst + (long)pHStack_70) = *(undefined1 *)((long)pHVar3 + uVar20 * 2 + 5)
      ;
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar21 * 2 + 4) + iVar5;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)pHVar3 + uVar21 * 2 + 5);
      iVar13 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar13;
      *(undefined1 *)((long)dst + uStack_68 + 1) = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      iVar16 = (uint)*(byte *)((long)pHVar3 + uVar22 * 2 + 4) + iVar16;
      *(undefined1 *)((long)dst + uStack_68 * 2 + 1) =
           *(undefined1 *)((long)pHVar3 + uVar22 * 2 + 5);
      uVar11 = (BStack_118.bitContainer << ((byte)iVar18 & 0x3f)) >> bVar12;
      uVar20 = (BStack_a0.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar18 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar18;
      uVar21 = (BStack_c8.bitContainer << ((byte)iVar13 & 0x3f)) >> bVar12;
      *(undefined1 *)((long)dst + (long)pHStack_70 + 1) =
           *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar20 * 2 + 4) + iVar5;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)pHVar3 + uVar20 * 2 + 5);
      iVar13 = (uint)*(byte *)((long)pHVar3 + uVar21 * 2 + 4) + iVar13;
      uVar11 = (BStack_f0.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar12;
      *(undefined1 *)((long)dst + uStack_68 + 2) = *(undefined1 *)((long)pHVar3 + uVar21 * 2 + 5);
      iVar16 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar16;
      *(undefined1 *)((long)dst + uStack_68 * 2 + 2) =
           *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (BStack_118.bitContainer << ((byte)iVar18 & 0x3f)) >> bVar12;
      iVar18 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar18;
      *(undefined1 *)((long)dst + (long)pHStack_70 + 2) =
           *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (BStack_a0.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      uVar20 = (BStack_c8.bitContainer << ((byte)iVar13 & 0x3f)) >> bVar12;
      uVar21 = (BStack_f0.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar12;
      BStack_a0.bitsConsumed = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar5;
      puStack_60 = (undefined1 *)((long)dst + 4);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      BStack_c8.bitsConsumed = (uint)*(byte *)((long)pHVar3 + uVar20 * 2 + 4) + iVar13;
      *(undefined1 *)((long)dst + uStack_68 + 3) = *(undefined1 *)((long)pHVar3 + uVar20 * 2 + 5);
      BStack_f0.bitsConsumed = (uint)*(byte *)((long)pHVar3 + uVar21 * 2 + 4) + iVar16;
      *(undefined1 *)((long)dst + uStack_68 * 2 + 3) =
           *(undefined1 *)((long)pHVar3 + uVar21 * 2 + 5);
      uVar11 = (BStack_118.bitContainer << ((byte)iVar18 & 0x3f)) >> bVar12;
      BStack_118.bitsConsumed = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar18;
      *(undefined1 *)((long)dst + (long)pHStack_70 + 3) =
           *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      BVar6 = BIT_reloadDStreamFast(&BStack_a0);
      BVar7 = BIT_reloadDStreamFast(&BStack_c8);
      BVar8 = BIT_reloadDStreamFast(&BStack_f0);
      BVar9 = BIT_reloadDStreamFast(&BStack_118);
      bVar26 = BVar9 == BIT_DStream_unfinished &&
               (BVar8 == BIT_DStream_unfinished &&
               (BVar7 == BIT_DStream_unfinished && BVar6 == BIT_DStream_unfinished));
      dst = puStack_60;
      pHVar25 = pHVar4;
    }
    cVar24 = (char)uStack_58;
    puVar15 = (undefined1 *)((long)dst + uStack_68);
    puVar17 = (undefined1 *)((long)dst + (long)pHVar25);
    puVar19 = (undefined1 *)((long)dst + uStack_68 * 2);
  }
  if (puStack_38 < puVar19 || (puStack_50 < puVar15 || puVar1 < dst)) {
    return 0xffffffffffffffec;
  }
  if ((long)puVar1 - (long)dst < 4) {
    if (BStack_a0.bitsConsumed < 0x41) {
      if (BStack_a0.ptr < BStack_a0.limitPtr) {
        if (BStack_a0.ptr == BStack_a0.start) goto LAB_003d59e8;
        uVar14 = (int)BStack_a0.ptr - (int)BStack_a0.start;
        if (BStack_a0.start <=
            (BitContainerType *)((long)BStack_a0.ptr - (ulong)(BStack_a0.bitsConsumed >> 3))) {
          uVar14 = BStack_a0.bitsConsumed >> 3;
        }
        BStack_a0.bitsConsumed = BStack_a0.bitsConsumed + uVar14 * -8;
      }
      else {
        uVar14 = BStack_a0.bitsConsumed >> 3;
        BStack_a0.bitsConsumed = BStack_a0.bitsConsumed & 7;
      }
      BStack_a0.ptr = (char *)((long)BStack_a0.ptr - (ulong)uVar14);
      BStack_a0.bitContainer = *(BitContainerType *)BStack_a0.ptr;
    }
    else {
      BStack_a0.ptr = "";
    }
  }
  else {
    bVar12 = -cVar24 & 0x3f;
    while (BStack_a0.bitsConsumed < 0x41) {
      if (BStack_a0.ptr < BStack_a0.limitPtr) {
        if (BStack_a0.ptr == BStack_a0.start) goto LAB_003d59e8;
        bVar26 = BStack_a0.start <=
                 (BitContainerType *)((long)BStack_a0.ptr - (ulong)(BStack_a0.bitsConsumed >> 3));
        uVar11 = (ulong)(uint)((int)BStack_a0.ptr - (int)BStack_a0.start);
        if (bVar26) {
          uVar11 = (ulong)(BStack_a0.bitsConsumed >> 3);
        }
        BStack_a0.bitsConsumed = BStack_a0.bitsConsumed + (int)uVar11 * -8;
      }
      else {
        uVar11 = (ulong)(BStack_a0.bitsConsumed >> 3);
        BStack_a0.bitsConsumed = BStack_a0.bitsConsumed & 7;
        bVar26 = true;
      }
      BStack_a0.ptr = (char *)((long)BStack_a0.ptr - uVar11);
      BStack_a0.bitContainer = *(BitContainerType *)BStack_a0.ptr;
      if ((puVar1 + -3 <= dst) || (!bVar26)) goto LAB_003d59e8;
      uVar11 = (BStack_a0.bitContainer << ((byte)BStack_a0.bitsConsumed & 0x3f)) >> bVar12;
      iVar5 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + BStack_a0.bitsConsumed;
      *(undefined1 *)dst = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (BStack_a0.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar5;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (BStack_a0.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar5;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (BStack_a0.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      bVar2 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      dst = (void *)((long)dst + 4);
      BStack_a0.bitsConsumed = (uint)bVar2 + iVar5;
    }
    BStack_a0.ptr = "";
  }
LAB_003d59e8:
  bVar12 = -cVar24 & 0x3f;
  for (; dst < puVar1; dst = (void *)((long)dst + 1)) {
    uVar11 = (BStack_a0.bitContainer << ((byte)BStack_a0.bitsConsumed & 0x3f)) >> bVar12;
    BStack_a0.bitsConsumed = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + BStack_a0.bitsConsumed;
    *(undefined1 *)dst = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
  }
  if ((long)puStack_50 - (long)puVar15 < 4) {
    if (0x40 < BStack_c8.bitsConsumed) goto LAB_003d5bf4;
    if (BStack_c8.ptr < BStack_c8.limitPtr) {
      if (BStack_c8.ptr != BStack_c8.start) {
        uVar14 = (int)BStack_c8.ptr - (int)BStack_c8.start;
        if (BStack_c8.start <=
            (BitContainerType *)((long)BStack_c8.ptr - (ulong)(BStack_c8.bitsConsumed >> 3))) {
          uVar14 = BStack_c8.bitsConsumed >> 3;
        }
        BStack_c8.bitsConsumed = BStack_c8.bitsConsumed + uVar14 * -8;
        goto LAB_003d5be6;
      }
    }
    else {
      uVar14 = BStack_c8.bitsConsumed >> 3;
      BStack_c8.bitsConsumed = BStack_c8.bitsConsumed & 7;
LAB_003d5be6:
      BStack_c8.ptr = (char *)((long)BStack_c8.ptr - (ulong)uVar14);
      BStack_c8.bitContainer = *(BitContainerType *)BStack_c8.ptr;
    }
  }
  else {
    while (BStack_c8.bitsConsumed < 0x41) {
      if (BStack_c8.ptr < BStack_c8.limitPtr) {
        if (BStack_c8.ptr == BStack_c8.start) goto LAB_003d5c2c;
        bVar26 = BStack_c8.start <=
                 (BitContainerType *)((long)BStack_c8.ptr - (ulong)(BStack_c8.bitsConsumed >> 3));
        uVar14 = (int)BStack_c8.ptr - (int)BStack_c8.start;
        if (bVar26) {
          uVar14 = BStack_c8.bitsConsumed >> 3;
        }
        BStack_c8.bitsConsumed = BStack_c8.bitsConsumed + uVar14 * -8;
      }
      else {
        uVar14 = BStack_c8.bitsConsumed >> 3;
        BStack_c8.bitsConsumed = BStack_c8.bitsConsumed & 7;
        bVar26 = true;
      }
      BStack_c8.ptr = (char *)((long)BStack_c8.ptr - (ulong)uVar14);
      BStack_c8.bitContainer = *(BitContainerType *)BStack_c8.ptr;
      if ((puStack_50 + -3 <= puVar15) || (!bVar26)) goto LAB_003d5c2c;
      uVar11 = (BStack_c8.bitContainer << ((byte)BStack_c8.bitsConsumed & 0x3f)) >> bVar12;
      iVar5 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + BStack_c8.bitsConsumed;
      *puVar15 = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (BStack_c8.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar5;
      puVar15[1] = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (BStack_c8.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar5;
      puVar15[2] = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (BStack_c8.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      bVar2 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4);
      puVar15[3] = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      puVar15 = puVar15 + 4;
      BStack_c8.bitsConsumed = (uint)bVar2 + iVar5;
    }
LAB_003d5bf4:
    BStack_c8.ptr = "";
  }
LAB_003d5c2c:
  for (; puVar15 < puStack_50; puVar15 = puVar15 + 1) {
    uVar11 = (BStack_c8.bitContainer << ((byte)BStack_c8.bitsConsumed & 0x3f)) >> bVar12;
    BStack_c8.bitsConsumed = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + BStack_c8.bitsConsumed;
    *puVar15 = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
  }
  if ((long)puStack_38 - (long)puVar19 < 4) {
    if (0x40 < BStack_f0.bitsConsumed) goto LAB_003d5de3;
    if (BStack_f0.ptr < BStack_f0.limitPtr) {
      if (BStack_f0.ptr != BStack_f0.start) {
        uVar14 = (int)BStack_f0.ptr - (int)BStack_f0.start;
        if (BStack_f0.start <=
            (BitContainerType *)((long)BStack_f0.ptr - (ulong)(BStack_f0.bitsConsumed >> 3))) {
          uVar14 = BStack_f0.bitsConsumed >> 3;
        }
        BStack_f0.bitsConsumed = BStack_f0.bitsConsumed + uVar14 * -8;
        goto LAB_003d5dd5;
      }
    }
    else {
      uVar14 = BStack_f0.bitsConsumed >> 3;
      BStack_f0.bitsConsumed = BStack_f0.bitsConsumed & 7;
LAB_003d5dd5:
      BStack_f0.ptr = (char *)((long)BStack_f0.ptr - (ulong)uVar14);
      BStack_f0.bitContainer = *(BitContainerType *)BStack_f0.ptr;
    }
  }
  else {
    while (BStack_f0.bitsConsumed < 0x41) {
      if (BStack_f0.ptr < BStack_f0.limitPtr) {
        if (BStack_f0.ptr == BStack_f0.start) goto LAB_003d5e1b;
        bVar26 = BStack_f0.start <=
                 (BitContainerType *)((long)BStack_f0.ptr - (ulong)(BStack_f0.bitsConsumed >> 3));
        uVar14 = (int)BStack_f0.ptr - (int)BStack_f0.start;
        if (bVar26) {
          uVar14 = BStack_f0.bitsConsumed >> 3;
        }
        BStack_f0.bitsConsumed = BStack_f0.bitsConsumed + uVar14 * -8;
      }
      else {
        uVar14 = BStack_f0.bitsConsumed >> 3;
        BStack_f0.bitsConsumed = BStack_f0.bitsConsumed & 7;
        bVar26 = true;
      }
      BStack_f0.ptr = (char *)((long)BStack_f0.ptr - (ulong)uVar14);
      BStack_f0.bitContainer = *(BitContainerType *)BStack_f0.ptr;
      if ((puStack_38 + -3 <= puVar19) || (!bVar26)) goto LAB_003d5e1b;
      uVar11 = (BStack_f0.bitContainer << ((byte)BStack_f0.bitsConsumed & 0x3f)) >> bVar12;
      iVar5 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + BStack_f0.bitsConsumed;
      *puVar19 = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (BStack_f0.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar5;
      puVar19[1] = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (BStack_f0.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar5;
      puVar19[2] = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (BStack_f0.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      bVar2 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4);
      puVar19[3] = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      puVar19 = puVar19 + 4;
      BStack_f0.bitsConsumed = (uint)bVar2 + iVar5;
    }
LAB_003d5de3:
    BStack_f0.ptr = "";
  }
LAB_003d5e1b:
  for (; puVar19 < puStack_38; puVar19 = puVar19 + 1) {
    uVar11 = (BStack_f0.bitContainer << ((byte)BStack_f0.bitsConsumed & 0x3f)) >> bVar12;
    BStack_f0.bitsConsumed = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + BStack_f0.bitsConsumed;
    *puVar19 = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
  }
  if ((long)puStack_78 - (long)puVar17 < 4) {
    if (BStack_118.bitsConsumed < 0x41) {
      if (BStack_118.ptr < BStack_118.limitPtr) {
        if (BStack_118.ptr == BStack_118.start) goto LAB_003d6038;
        uVar14 = (int)BStack_118.ptr - (int)BStack_118.start;
        if (BStack_118.start <=
            (BitContainerType *)((long)BStack_118.ptr - (ulong)(BStack_118.bitsConsumed >> 3))) {
          uVar14 = BStack_118.bitsConsumed >> 3;
        }
        BStack_118.bitsConsumed = BStack_118.bitsConsumed + uVar14 * -8;
      }
      else {
        uVar14 = BStack_118.bitsConsumed >> 3;
        BStack_118.bitsConsumed = BStack_118.bitsConsumed & 7;
      }
      BStack_118.ptr = (char *)((long)BStack_118.ptr - (ulong)uVar14);
      BStack_118.bitContainer = *(BitContainerType *)BStack_118.ptr;
    }
    else {
      BStack_118.ptr = "";
    }
  }
  else {
    while (BStack_118.bitsConsumed < 0x41) {
      if (BStack_118.ptr < BStack_118.limitPtr) {
        if (BStack_118.ptr == BStack_118.start) goto LAB_003d6038;
        bVar26 = BStack_118.start <=
                 (BitContainerType *)((long)BStack_118.ptr - (ulong)(BStack_118.bitsConsumed >> 3));
        uVar14 = (int)BStack_118.ptr - (int)BStack_118.start;
        if (bVar26) {
          uVar14 = BStack_118.bitsConsumed >> 3;
        }
        BStack_118.bitsConsumed = BStack_118.bitsConsumed + uVar14 * -8;
      }
      else {
        uVar14 = BStack_118.bitsConsumed >> 3;
        BStack_118.bitsConsumed = BStack_118.bitsConsumed & 7;
        bVar26 = true;
      }
      BStack_118.ptr = (char *)((long)BStack_118.ptr - (ulong)uVar14);
      BStack_118.bitContainer = *(BitContainerType *)BStack_118.ptr;
      if ((puStack_40 <= puVar17) || (!bVar26)) goto LAB_003d6038;
      uVar11 = (BStack_118.bitContainer << ((byte)BStack_118.bitsConsumed & 0x3f)) >> bVar12;
      iVar5 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + BStack_118.bitsConsumed;
      *puVar17 = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (BStack_118.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar5;
      puVar17[1] = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (BStack_118.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      iVar5 = (uint)*(byte *)((long)pHVar3 + uVar11 * 2 + 4) + iVar5;
      puVar17[2] = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      uVar11 = (BStack_118.bitContainer << ((byte)iVar5 & 0x3f)) >> bVar12;
      bVar2 = *(byte *)((long)pHVar3 + uVar11 * 2 + 4);
      puVar17[3] = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
      puVar17 = puVar17 + 4;
      BStack_118.bitsConsumed = (uint)bVar2 + iVar5;
    }
    BStack_118.ptr = "";
  }
LAB_003d6038:
  for (; puVar17 < puStack_78; puVar17 = puVar17 + 1) {
    uVar11 = (BStack_118.bitContainer << ((byte)BStack_118.bitsConsumed & 0x3f)) >> bVar12;
    BStack_118.bitsConsumed = *(byte *)((long)pHVar3 + uVar11 * 2 + 4) + BStack_118.bitsConsumed;
    *puVar17 = *(undefined1 *)((long)pHVar3 + uVar11 * 2 + 5);
  }
  sVar10 = 0xffffffffffffffec;
  if (BStack_118.bitsConsumed != 0x40) {
    sStack_48 = sVar10;
  }
  if (BStack_118.ptr != BStack_118.start) {
    sStack_48 = sVar10;
  }
  if (BStack_f0.bitsConsumed != 0x40) {
    sStack_48 = sVar10;
  }
  if (BStack_f0.ptr != BStack_f0.start) {
    sStack_48 = sVar10;
  }
  if (BStack_c8.bitsConsumed != 0x40) {
    sStack_48 = sVar10;
  }
  if (BStack_c8.ptr != BStack_c8.start) {
    sStack_48 = sVar10;
  }
  if (BStack_a0.bitsConsumed != 0x40) {
    sStack_48 = sVar10;
  }
  if (BStack_a0.ptr != BStack_a0.start) {
    sStack_48 = sVar10;
  }
  return sStack_48;
}

Assistant:

size_t HUF_decompress4X_usingDTable(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int flags)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#endif
}